

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
TSMuxer::getLastPts(vector<long,_std::allocator<long>_> *__return_storage_ptr__,TSMuxer *this)

{
  long *plVar1;
  long *i;
  long *plVar2;
  long local_38;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::reserve
            (__return_storage_ptr__,
             (long)(this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  plVar1 = (this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (plVar2 = (this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start; plVar2 != plVar1; plVar2 = plVar2 + 1) {
    local_38 = *plVar2 / 0xe5b0 + this->m_timeOffset;
    std::vector<long,_std::allocator<long>_>::emplace_back<long>(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int64_t> TSMuxer::getLastPts() const
{
    std::vector<int64_t> rez;
    rez.reserve(m_lastPts.size());
    for (const auto& i : m_lastPts) rez.push_back(internalClockToPts(i) + m_timeOffset);
    return rez;
}